

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O3

void __thiscall Assimp::glTFExporter::ExportMaterials(glTFExporter *this)

{
  aiMaterial *pMat;
  Material *pMVar1;
  size_type sVar2;
  bool bVar3;
  aiReturn aVar4;
  aiScene *paVar5;
  vector<glTF::Material_*,_std::allocator<glTF::Material_*>_> *pvVar6;
  uint uVar7;
  ulong uVar8;
  Ref<glTF::Material> RVar9;
  string name;
  aiString aiName;
  string local_478;
  string local_458;
  aiString local_434;
  
  local_434.length = 0;
  local_434.data[0] = '\0';
  memset(local_434.data + 1,0x1b,0x3ff);
  paVar5 = this->mScene;
  if (paVar5->mNumMaterials != 0) {
    uVar8 = 0;
    do {
      local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
      pMat = paVar5->mMaterials[uVar8];
      local_478._M_string_length = 0;
      local_478.field_2._M_local_buf[0] = '\0';
      aVar4 = aiGetMaterialString(pMat,"?mat.name",0,0,&local_434);
      sVar2 = local_478._M_string_length;
      if (aVar4 == aiReturn_SUCCESS) {
        strlen(local_434.data);
        std::__cxx11::string::_M_replace((ulong)&local_478,0,(char *)sVar2,(ulong)local_434.data);
      }
      glTF::Asset::FindUniqueID
                (&local_458,
                 (this->mAsset).super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_478,"material");
      std::__cxx11::string::operator=((string *)&local_478,(string *)&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
      }
      RVar9 = glTF::LazyDict<glTF::Material>::Create
                        (&((this->mAsset).
                           super___shared_ptr<glTF::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          materials,local_478._M_dataplus._M_p);
      pvVar6 = RVar9.vector;
      uVar7 = RVar9.index;
      GetMatColorOrTex(this,pMat,
                       &(pvVar6->
                        super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar7]->ambient,"$clr.ambient",0,0,
                       aiTextureType_AMBIENT);
      GetMatColorOrTex(this,pMat,
                       &(pvVar6->
                        super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar7]->diffuse,"$clr.diffuse",0,0,
                       aiTextureType_DIFFUSE);
      GetMatColorOrTex(this,pMat,
                       &(pvVar6->
                        super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar7]->specular,"$clr.specular",0,
                       0,aiTextureType_SPECULAR);
      GetMatColorOrTex(this,pMat,
                       &(pvVar6->
                        super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar7]->emission,"$clr.emissive",0,
                       0,aiTextureType_EMISSIVE);
      aVar4 = aiGetMaterialFloatArray
                        (pMat,"$mat.opacity",0,0,
                         &(pvVar6->
                          super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>).
                          _M_impl.super__Vector_impl_data._M_start[uVar7]->transparency,(uint *)0x0)
      ;
      pMVar1 = (pvVar6->super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      if (aVar4 == aiReturn_SUCCESS) {
        bVar3 = (bool)(-(pMVar1->transparency != 1.0) & 1);
      }
      else {
        bVar3 = false;
      }
      pMVar1->transparent = bVar3;
      if (pMat == (aiMaterial *)0x0) {
        __assert_fail("nullptr != mat",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/glTF/glTFExporter.cpp"
                      ,0x115,
                      "void (anonymous namespace)::GetMatScalar(const aiMaterial *, float &, const char *, int, int)"
                     );
      }
      aiGetMaterialFloatArray
                (pMat,"$mat.shininess",0,0,
                 &(pvVar6->super__Vector_base<glTF::Material_*,_std::allocator<glTF::Material_*>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar7]->shininess,(uint *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_478._M_dataplus._M_p != &local_478.field_2) {
        operator_delete(local_478._M_dataplus._M_p,
                        CONCAT71(local_478.field_2._M_allocated_capacity._1_7_,
                                 local_478.field_2._M_local_buf[0]) + 1);
      }
      uVar8 = uVar8 + 1;
      paVar5 = this->mScene;
    } while (uVar8 < paVar5->mNumMaterials);
  }
  return;
}

Assistant:

void glTFExporter::ExportMaterials()
{
    aiString aiName;
    for (unsigned int i = 0; i < mScene->mNumMaterials; ++i) {
        const aiMaterial* mat = mScene->mMaterials[i];


        std::string name;
        if (mat->Get(AI_MATKEY_NAME, aiName) == AI_SUCCESS) {
            name = aiName.C_Str();
        }
        name = mAsset->FindUniqueID(name, "material");

        Ref<Material> m = mAsset->materials.Create(name);

        GetMatColorOrTex(mat, m->ambient, AI_MATKEY_COLOR_AMBIENT, aiTextureType_AMBIENT);
        GetMatColorOrTex(mat, m->diffuse, AI_MATKEY_COLOR_DIFFUSE, aiTextureType_DIFFUSE);
        GetMatColorOrTex(mat, m->specular, AI_MATKEY_COLOR_SPECULAR, aiTextureType_SPECULAR);
        GetMatColorOrTex(mat, m->emission, AI_MATKEY_COLOR_EMISSIVE, aiTextureType_EMISSIVE);

        m->transparent = mat->Get(AI_MATKEY_OPACITY, m->transparency) == aiReturn_SUCCESS && m->transparency != 1.0;

        GetMatScalar(mat, m->shininess, AI_MATKEY_SHININESS);
    }
}